

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_formatting.cpp
# Opt level: O1

void test_manip<wchar_t>(string *e_charset)

{
  wchar_t *pwVar1;
  size_type *psVar2;
  size_type *psVar3;
  wostringstream *pwVar4;
  add_ftime<wchar_t> *paVar5;
  long lVar6;
  void *pvVar7;
  size_type *__format;
  int iVar8;
  ulong uVar9;
  ostream *poVar10;
  wistream *pwVar11;
  long *plVar12;
  string *psVar13;
  time_t tVar14;
  tm *__tp;
  size_t sVar15;
  long lVar16;
  runtime_error *prVar17;
  wchar_t *pwVar18;
  uint uVar19;
  wchar_t wVar20;
  pointer pcVar21;
  bool bVar22;
  locale local_1260 [8];
  locale local_1258 [8];
  locale local_1250 [8];
  locale local_1248 [8];
  locale local_1240 [8];
  locale local_1238 [8];
  locale local_1230 [8];
  locale local_1228 [8];
  locale local_1220 [8];
  locale local_1218 [8];
  locale local_1210 [8];
  locale local_1208 [8];
  locale local_1200 [8];
  locale local_11f8 [8];
  locale local_11f0 [8];
  locale local_11e8 [8];
  locale local_11e0 [8];
  locale local_11d8 [8];
  locale local_11d0 [8];
  locale local_11c8 [8];
  locale local_11c0 [8];
  locale local_11b8 [8];
  locale local_11b0 [8];
  locale local_11a8 [8];
  locale local_11a0 [8];
  locale local_1198 [8];
  locale local_1190 [8];
  locale local_1188 [8];
  locale local_1180 [8];
  locale local_1178 [8];
  locale local_1170 [8];
  locale local_1168 [8];
  locale local_1160 [8];
  locale local_1158 [8];
  locale local_1150 [8];
  locale local_1148 [8];
  locale local_1140 [8];
  locale local_1138 [8];
  locale local_1130 [8];
  locale local_1128 [8];
  locale local_1120 [8];
  locale local_1118 [8];
  locale local_1110 [8];
  locale local_1108 [8];
  locale local_1100 [8];
  locale local_10f8 [8];
  locale local_10f0 [8];
  locale local_10e8 [8];
  locale local_10e0 [8];
  locale local_10d8 [8];
  locale local_10d0 [8];
  locale local_10c8 [8];
  locale local_10c0 [8];
  locale local_10b8 [8];
  locale local_10b0 [8];
  locale local_10a8 [8];
  locale local_10a0 [8];
  locale local_1098 [8];
  locale local_1090 [8];
  locale local_1088 [8];
  locale local_1080 [8];
  locale local_1078 [8];
  locale local_1070 [8];
  locale local_1068 [8];
  locale local_1060 [8];
  locale local_1058 [8];
  locale local_1050 [8];
  locale local_1048 [8];
  locale local_1040 [8];
  locale local_1038 [8];
  locale local_1030 [8];
  locale local_1028 [8];
  locale local_1020 [8];
  locale local_1018 [8];
  locale local_1010 [8];
  locale local_1008 [8];
  locale local_1000 [8];
  locale local_ff8 [8];
  locale local_ff0 [8];
  locale local_fe8 [8];
  locale local_fe0 [8];
  locale local_fd8 [8];
  locale local_fd0 [8];
  locale local_fc8 [8];
  locale local_fc0 [8];
  locale local_fb8 [8];
  locale local_fb0 [8];
  locale local_fa8 [8];
  locale local_fa0 [8];
  locale local_f98 [8];
  locale local_f90 [8];
  locale local_f88 [8];
  locale local_f80 [8];
  locale local_f78 [8];
  locale local_f70 [8];
  locale local_f68 [8];
  locale local_f60 [8];
  locale local_f58 [8];
  locale local_f50 [8];
  locale local_f48 [8];
  locale local_f40 [8];
  locale local_f38 [8];
  locale local_f30 [8];
  locale local_f28 [8];
  locale local_f20 [8];
  locale local_f18 [8];
  locale local_f10 [8];
  locale local_f08 [8];
  locale local_f00 [8];
  locale local_ef8 [8];
  locale local_ef0 [8];
  locale local_ee8 [8];
  locale local_ee0 [8];
  locale local_ed8 [8];
  locale local_ed0 [8];
  locale local_ec8 [8];
  locale local_ec0 [8];
  locale local_eb8 [8];
  locale local_eb0 [8];
  locale local_ea8 [8];
  locale local_ea0 [8];
  locale local_e98 [8];
  locale local_e90 [8];
  locale local_e88 [8];
  locale local_e80 [8];
  locale local_e78 [8];
  locale local_e70 [8];
  locale local_e68 [8];
  locale local_e60 [8];
  locale local_e58 [8];
  locale local_e50 [8];
  locale local_e48 [8];
  locale local_e40 [8];
  locale local_e38 [8];
  locale local_e30 [8];
  locale local_e28 [8];
  locale local_e20 [8];
  locale local_e18 [8];
  locale local_e10 [8];
  locale local_e08 [8];
  locale local_e00 [8];
  locale local_df8 [8];
  locale local_df0 [8];
  locale local_de8 [8];
  locale local_de0 [8];
  locale local_dd8 [8];
  locale local_dd0 [8];
  locale local_dc8 [8];
  locale local_dc0 [8];
  locale local_db8 [8];
  locale local_db0 [8];
  locale local_da8 [8];
  locale local_da0 [8];
  locale local_d98 [8];
  locale local_d90 [8];
  locale local_d88 [8];
  locale local_d80 [8];
  locale local_d78 [8];
  locale local_d70 [8];
  locale local_d68 [8];
  locale local_d60 [8];
  locale local_d58 [8];
  locale local_d50 [8];
  locale local_d48 [8];
  locale local_d40 [8];
  locale local_d38 [8];
  locale local_d30 [8];
  locale local_d28 [8];
  locale local_d20 [8];
  locale local_d18 [8];
  locale local_d10 [8];
  locale local_d08 [8];
  locale local_d00 [8];
  long local_cf8;
  time_t lnow;
  locale local_ce8 [8];
  locale local_ce0 [8];
  locale local_cd8 [8];
  size_type *local_cd0;
  string marks;
  long local_ca8;
  undefined1 local_ca0 [16];
  locale local_c90 [8];
  locale local_c88 [8];
  locale local_c80 [8];
  locale local_c78 [8];
  locale local_c70 [8];
  locale local_c68 [8];
  locale local_c60 [8];
  locale local_c58 [8];
  locale local_c50 [8];
  locale local_c48 [8];
  locale local_c40 [8];
  locale local_c38 [8];
  locale local_c30 [8];
  locale local_c28 [8];
  locale local_c20 [8];
  locale local_c18 [8];
  locale local_c10 [8];
  locale local_c08 [8];
  locale local_c00 [8];
  locale local_bf8 [8];
  locale local_bf0 [8];
  locale local_be8 [8];
  locale local_be0 [8];
  locale local_bd8 [8];
  locale local_bd0 [8];
  locale local_bc8 [8];
  locale local_bc0 [8];
  locale local_bb8 [8];
  locale local_bb0 [8];
  locale local_ba8 [8];
  locale local_ba0 [8];
  locale local_b98 [8];
  locale local_b90 [8];
  locale local_b88 [8];
  locale local_b80 [8];
  locale local_b78 [8];
  locale local_b70 [8];
  locale local_b68 [8];
  locale local_b60 [8];
  locale local_b58 [8];
  locale local_b50 [8];
  locale local_b48 [8];
  locale local_b40 [8];
  locale local_b38 [8];
  locale local_b30 [8];
  locale local_b28 [8];
  locale local_b20 [8];
  locale local_b18 [8];
  locale local_b10 [8];
  locale local_b08 [8];
  locale local_b00 [8];
  locale local_af8 [8];
  locale local_af0 [8];
  locale local_ae8 [8];
  locale local_ae0 [8];
  locale local_ad8 [8];
  locale local_ad0 [8];
  locale local_ac8 [8];
  locale local_ac0 [8];
  locale local_ab8 [8];
  locale local_ab0 [8];
  locale local_aa8 [8];
  locale local_aa0 [8];
  locale local_a98 [8];
  locale local_a90 [8];
  locale local_a88 [8];
  locale local_a80 [8];
  locale local_a78 [8];
  locale local_a70 [8];
  locale local_a68 [8];
  locale local_a60 [8];
  locale local_a58 [8];
  locale local_a50 [8];
  locale local_a48 [8];
  locale local_a40 [8];
  locale local_a38 [8];
  locale local_a30 [8];
  locale local_a28 [8];
  locale local_a20 [8];
  locale local_a18 [8];
  locale local_a10 [8];
  locale local_a08 [8];
  locale local_a00 [8];
  locale local_9f8 [8];
  locale local_9f0 [8];
  locale local_9e8 [8];
  locale local_9e0 [8];
  locale local_9d8 [8];
  locale local_9d0 [8];
  locale local_9c8 [8];
  locale local_9c0 [8];
  locale local_9b8 [8];
  locale local_9b0 [8];
  locale local_9a8 [8];
  locale local_9a0 [8];
  locale local_998 [8];
  locale local_990 [8];
  locale local_988 [8];
  locale local_980 [8];
  locale local_978 [8];
  locale local_970 [8];
  locale local_968 [8];
  locale local_960 [8];
  locale local_958 [8];
  locale local_950 [8];
  locale local_948 [8];
  locale local_940 [8];
  locale local_938 [8];
  locale local_930 [8];
  locale local_928 [8];
  locale local_920 [8];
  locale local_918 [8];
  locale local_910 [8];
  locale local_908 [8];
  locale local_900 [8];
  locale local_8f8 [8];
  locale local_8f0 [8];
  locale local_8e8 [8];
  locale local_8e0 [8];
  locale local_8d8 [8];
  locale local_8d0 [8];
  locale local_8c8 [8];
  locale local_8c0 [8];
  locale local_8b8 [8];
  locale local_8b0 [8];
  locale local_8a8 [8];
  locale local_8a0 [8];
  locale local_898 [8];
  locale local_890 [8];
  locale local_888 [8];
  locale local_880 [8];
  locale local_878 [8];
  locale local_870 [8];
  locale local_868 [8];
  locale local_860 [8];
  locale local_858 [8];
  locale local_850 [8];
  locale local_848 [8];
  locale local_840 [8];
  locale local_838 [8];
  locale local_830 [8];
  locale local_828 [8];
  locale local_820 [8];
  locale local_818 [8];
  locale local_810 [8];
  locale local_808 [8];
  locale local_800 [8];
  locale local_7f8 [8];
  locale local_7f0 [8];
  locale local_7e8 [8];
  locale local_7e0 [8];
  locale local_7d8 [8];
  locale local_7d0 [8];
  locale local_7c8 [8];
  locale local_7c0 [8];
  locale local_7b8 [8];
  locale local_7b0 [8];
  locale local_7a8 [8];
  locale local_7a0 [8];
  locale local_798 [8];
  locale local_790 [8];
  locale local_788 [8];
  locale local_780 [8];
  locale local_778 [8];
  generator local_770 [8];
  generator g;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_758;
  size_type *local_748;
  string format;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> format_string;
  string expected_f [4];
  string result [26];
  undefined1 local_338 [8];
  char local_time_str [256];
  undefined1 local_230 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> act;
  ios_base local_1c0 [264];
  undefined1 local_b8 [8];
  string sample_f [4];
  locale loc;
  
  booster::locale::generator::generator(local_770);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),"en_US.",e_charset);
  booster::locale::generator::generate((string *)(sample_f[3].field_2._M_local_buf + 8));
  if ((size_type *)expected_f[3].field_2._8_8_ != &result[0]._M_string_length) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1260);
  std::locale::~locale(local_1260);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<double>(1200.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"1200.1","");
  std::locale::locale(local_c90,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_c90);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  pwVar1 = (wchar_t *)(local_time_str + 8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_c90);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  psVar2 = &act._M_string_length;
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"1200.1\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1258);
  std::locale::~locale(local_1258);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"1200.1","");
  std::locale::locale(local_c88,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c88);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c88);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1200.1) || (NAN((double)format_string.field_2._8_8_)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1200.1)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1250);
  std::locale::~locale(local_1250);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"1200.1","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_c80,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c80);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c80);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1200.1) || (NAN((double)format_string.field_2._8_8_)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1200.1)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1248);
  std::locale::~locale(local_1248);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<double>(1200.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"1,200.1","");
  std::locale::locale(local_c78,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_c78);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_c78);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"1,200.1\",loc))",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1240);
  std::locale::~locale(local_1240);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"1,200.1","");
  std::locale::locale(local_c70,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c70);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c70);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1200.1) || (NAN((double)format_string.field_2._8_8_)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1200.1)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1238);
  std::locale::~locale(local_1238);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"1,200.1","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_c68,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c68);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c68);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1200.1) || (NAN((double)format_string.field_2._8_8_)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1200.1)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1230);
  std::locale::~locale(local_1230);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  std::wios::fill();
  *(undefined4 *)((long)&result[6].field_2 + lVar16 + 8) = 0x5f;
  *(undefined8 *)
   ((long)&result[0]._M_string_length + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 6;
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0x5fe);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"_1,534","");
  std::locale::locale(local_c60,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_c60);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_c60);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"_1,534\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1228);
  std::locale::~locale(local_1228);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xffffff4f | 0x20;
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  std::wios::fill();
  *(undefined4 *)((long)&result[6].field_2 + lVar16 + 8) = 0x5f;
  *(undefined8 *)
   ((long)&result[0]._M_string_length + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 6;
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0x5fe);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"1,534_","");
  std::locale::locale(local_c58,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_c58);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_c58);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"1,534_\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1220);
  std::locale::~locale(local_1220);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),-0x8000);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-32,768","");
  std::locale::locale(local_c50,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_c50);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_c50);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"-32,768\",loc))",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1218);
  std::locale::~locale(local_1218);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0x7fff);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"32,767","");
  std::locale::locale(local_c48,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_c48);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_c48);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"32,767\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1210);
  std::locale::~locale(local_1210);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"-32,768","");
  std::locale::locale(local_c40,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c40);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c40);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       (short *)(format_string.field_2._M_local_buf + 2));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10," (v)==(std::numeric_limits<short>::min())",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  iVar8 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar8;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_230);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar8;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1208);
  std::locale::~locale(local_1208);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-32,768","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_c38,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c38);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c38);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       (short *)(format_string.field_2._M_local_buf + 2));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10," (v)==(std::numeric_limits<short>::min())",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  iVar8 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar8;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_230);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar8;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1200);
  std::locale::~locale(local_1200);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"32,767","");
  std::locale::locale(local_c30,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c30);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c30);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       (short *)(format_string.field_2._M_local_buf + 2));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2]._0_2_ != 0x7fff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<short>::max())",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11f8);
  std::locale::~locale(local_11f8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"32,767","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_c28,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c28);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c28);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       (short *)(format_string.field_2._M_local_buf + 2));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2]._0_2_ != 0x7fff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<short>::max())",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_11f0);
  std::locale::~locale(local_11f0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"0","");
  std::locale::locale(local_c20,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_c20);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_c20);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"0\",loc))",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_11e8);
  std::locale::~locale(local_11e8);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"65,535","");
  std::locale::locale(local_c18,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_c18);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_c18);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"65,535\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11e0);
  std::locale::~locale(local_11e0);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"0","");
  std::locale::locale(local_c10,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c10);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c10);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<unsigned_short>
                      ((ushort *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2]._0_2_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<unsigned short>::min())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11d8);
  std::locale::~locale(local_11d8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"0","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_c08,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c08);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c08);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<unsigned_short>
                      ((ushort *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2]._0_2_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<unsigned short>::min())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11d0);
  std::locale::~locale(local_11d0);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"65,535","");
  std::locale::locale(local_c00,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_c00);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_c00);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<unsigned_short>
                      ((ushort *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2]._0_2_ != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<unsigned short>::max())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11c8);
  std::locale::~locale(local_11c8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"65,535","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_bf8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_bf8);
  psVar3 = &result[0]._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_bf8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<unsigned_short>
                      ((ushort *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2]._0_2_ != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<unsigned short>::max())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"-1","");
  std::locale::locale(local_bf0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_bf0);
  std::locale::~locale(local_bf0);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11c0);
  std::locale::~locale(local_11c0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::_M_extract<unsigned_short>((ushort *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xeb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11b8);
  std::locale::~locale(local_11b8);
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_short>((ushort *)(expected_f[3].field_2._M_local_buf + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xeb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  bVar22 = short_parsing_fails();
  if (bVar22) {
    expected_f[3].field_2._8_8_ = psVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&expected_f[3].field_2 + 8),"65,535","");
    std::locale::locale(local_be8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_be8);
    std::locale::~locale(local_be8);
    if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
      operator_delete((void *)expected_f[3].field_2._8_8_);
    }
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_11b0);
    std::locale::~locale(local_11b0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    std::wistream::operator>>
              ((wistream *)(expected_f[3].field_2._M_local_buf + 8),(short *)local_b8);
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xed);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_338 = (undefined1  [8])pwVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_338);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_11a8);
    std::locale::~locale(local_11a8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
    *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
    std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    test_counter = test_counter + 1;
    std::wistream::operator>>
              ((wistream *)(expected_f[3].field_2._M_local_buf + 8),(short *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xed);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (0x14 < error_counter) {
      error_counter = error_counter + 1;
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    error_counter = error_counter + 1;
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
  }
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_11a0);
  std::locale::~locale(local_11a0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),-0x80000000);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-2,147,483,648","");
  std::locale::locale(local_be0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_be0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_be0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"-2,147,483,648\",loc))",0x40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1198);
  std::locale::~locale(local_1198);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0x7fffffff);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"2,147,483,647","");
  std::locale::locale(local_bd8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_bd8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_bd8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"2,147,483,647\",loc))",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1190);
  std::locale::~locale(local_1190);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"-2,147,483,648","");
  std::locale::locale(local_bd0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_bd0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_bd0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10," (v)==(std::numeric_limits<int>::min())",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  iVar8 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar8;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_230);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar8;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1188);
  std::locale::~locale(local_1188);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-2,147,483,648","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_bc8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_bc8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_bc8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10," (v)==(std::numeric_limits<int>::min())",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  iVar8 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar8;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_230);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar8;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1180);
  std::locale::~locale(local_1180);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"2,147,483,647","");
  std::locale::locale(local_bc0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_bc0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_bc0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\x7fffffff') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<int>::max())",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1178);
  std::locale::~locale(local_1178);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"2,147,483,647","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_bb8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_bb8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_bb8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\x7fffffff') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<int>::max())",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1170);
  std::locale::~locale(local_1170);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"0","");
  std::locale::locale(local_bb0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_bb0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_bb0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"0\",loc))",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1168);
  std::locale::~locale(local_1168);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4,294,967,295","");
  std::locale::locale(local_ba8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_ba8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_ba8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"4,294,967,295\",loc))",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1160);
  std::locale::~locale(local_1160);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"0","");
  std::locale::locale(local_ba0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_ba0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_ba0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<unsigned_int>
                      ((uint *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<unsigned int>::min())",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1158);
  std::locale::~locale(local_1158);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"0","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_b98,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b98);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b98);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<unsigned_int>
                      ((uint *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<unsigned int>::min())",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1150);
  std::locale::~locale(local_1150);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4,294,967,295","");
  std::locale::locale(local_b90,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b90);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b90);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<unsigned_int>
                      ((uint *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\xffffffff') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<unsigned int>::max())",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1148);
  std::locale::~locale(local_1148);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4,294,967,295","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_b88,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b88);
  psVar3 = &result[0]._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b88);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<unsigned_int>
                      ((uint *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\xffffffff') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<unsigned int>::max())",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"-1","");
  std::locale::locale(local_b80,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b80);
  std::locale::~locale(local_b80);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1140);
  std::locale::~locale(local_1140);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::_M_extract<unsigned_int>((uint *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1138);
  std::locale::~locale(local_1138);
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_int>((uint *)(expected_f[3].field_2._M_local_buf + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"4,294,967,295","");
  std::locale::locale(local_b78,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b78);
  std::locale::~locale(local_b78);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1130);
  std::locale::~locale(local_1130);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::operator>>((wistream *)(expected_f[3].field_2._M_local_buf + 8),(int *)local_b8);
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1128);
  std::locale::~locale(local_1128);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)(expected_f[3].field_2._M_local_buf + 8),(int *)local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xf4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1120);
  std::locale::~locale(local_1120);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"-9,223,372,036,854,775,808","");
  std::locale::locale(local_b70,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_b70);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_b70);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " (ss.str())==(to_correct_string<CharType>(\"-9,223,372,036,854,775,808\",loc))",0x4c
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1118);
  std::locale::~locale(local_1118);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"9,223,372,036,854,775,807","")
  ;
  std::locale::locale(local_b68,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_b68);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_b68);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))",0x4b)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1110);
  std::locale::~locale(local_1110);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"-9,223,372,036,854,775,808","");
  std::locale::locale(local_b60,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b60);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b60);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != -0x8000000000000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<long>::min())",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1108);
  std::locale::~locale(local_1108);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"-9,223,372,036,854,775,808","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_b58,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b58);
  psVar2 = &act._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b58);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != -0x8000000000000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<long>::min())",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1100);
  std::locale::~locale(local_1100);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"9,223,372,036,854,775,807","");
  std::locale::locale(local_b50,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b50);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b50);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x7fffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<long>::max())",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10f8);
  std::locale::~locale(local_10f8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"9,223,372,036,854,775,807","")
  ;
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_b48,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b48);
  psVar3 = &result[0]._M_string_length;
  psVar2 = &act._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b48);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x7fffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<long>::max())",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_10f0);
  std::locale::~locale(local_10f0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"0","");
  std::locale::locale(local_b40,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_b40);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_b40);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"0\",loc))",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_10e8);
  std::locale::~locale(local_10e8);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"18446744073709551615","");
  std::locale::locale(local_b38,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_b38);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_b38);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xfe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"18446744073709551615\",loc))",
               0x46);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"-1","");
  std::locale::locale(local_b30,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b30);
  std::locale::~locale(local_b30);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10e0);
  std::locale::~locale(local_10e0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::_M_extract<unsigned_long>((ulong *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10d8);
  std::locale::~locale(local_10d8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_long>((ulong *)(expected_f[3].field_2._M_local_buf + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_10d0);
  std::locale::~locale(local_10d0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<long_long>((longlong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"-9,223,372,036,854,775,808","");
  std::locale::locale(local_b28,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_b28);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_b28);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " (ss.str())==(to_correct_string<CharType>(\"-9,223,372,036,854,775,808\",loc))",0x4c
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_10c8);
  std::locale::~locale(local_10c8);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<long_long>((longlong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"9,223,372,036,854,775,807","")
  ;
  std::locale::locale(local_b20,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_b20);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_b20);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))",0x4b)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10c0);
  std::locale::~locale(local_10c0);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"-9,223,372,036,854,775,808","");
  std::locale::locale(local_b18,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b18);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b18);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<long_long>
                      ((longlong *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != -0x8000000000000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<long long>::min())",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10b8);
  std::locale::~locale(local_10b8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"-9,223,372,036,854,775,808","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_b10,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b10);
  psVar2 = &act._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b10);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<long_long>
                      ((longlong *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != -0x8000000000000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<long long>::min())",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10b0);
  std::locale::~locale(local_10b0);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"9,223,372,036,854,775,807","");
  std::locale::locale(local_b08,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b08);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b08);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<long_long>
                      ((longlong *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x7fffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<long long>::max())",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10a8);
  std::locale::~locale(local_10a8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"9,223,372,036,854,775,807","")
  ;
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_b00,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_b00);
  psVar3 = &result[0]._M_string_length;
  psVar2 = &act._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_b00);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<long_long>
                      ((longlong *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x7fffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (v)==(std::numeric_limits<long long>::max())",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_10a0);
  std::locale::~locale(local_10a0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"0","");
  std::locale::locale(local_af8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_af8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_af8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"0\",loc))",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1098);
  std::locale::~locale(local_1098);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"18446744073709551615","");
  std::locale::locale(local_af0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_af0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_af0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"18446744073709551615\",loc))",
               0x46);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1090);
  std::locale::~locale(local_1090);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"9,223,372,036,854,775,807","")
  ;
  std::locale::locale(local_ae8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_ae8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_ae8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x106);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))",0x4b)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1088);
  std::locale::~locale(local_1088);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"9223372036854775808","");
  std::locale::locale(local_ae0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_ae0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_ae0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x107);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"9223372036854775808\",loc))",
               0x45);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"-1","");
  std::locale::locale(local_ad8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_ad8);
  std::locale::~locale(local_ad8);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1080);
  std::locale::~locale(local_1080);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::_M_extract<unsigned_long_long>
            ((ulonglong *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1078);
  std::locale::~locale(local_1078);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_long_long>
            ((ulonglong *)(expected_f[3].field_2._M_local_buf + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x108);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1070);
  std::locale::~locale(local_1070);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xffffff4f | 0x20;
  *(undefined8 *)
   ((long)&result[0]._M_string_length + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0xf);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"15 ","");
  std::locale::locale(local_ad0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_ad0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_ad0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"15 \",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1068);
  std::locale::~locale(local_1068);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"15 ","");
  std::locale::locale(local_ac8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_ac8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_ac8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xffffff4f | 0x20;
  *(undefined8 *)
   ((long)&result[0]._M_string_length + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\x0f') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(15)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1060);
  std::locale::~locale(local_1060);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"15 ","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_ac0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_ac0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_ac0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xffffff4f | 0x20;
  *(undefined8 *)
   ((long)&result[0]._M_string_length + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\x0f') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(15)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1058);
  std::locale::~locale(local_1058);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xffffff4f | 0x80;
  *(undefined8 *)
   ((long)&result[0]._M_string_length + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0xf);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8," 15","");
  std::locale::locale(local_ab8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_ab8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_ab8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\" 15\",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1050);
  std::locale::~locale(local_1050);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338," 15","");
  std::locale::locale(local_ab0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_ab0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_ab0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xffffff4f | 0x80;
  *(undefined8 *)
   ((long)&result[0]._M_string_length + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\x0f') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(15)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1048);
  std::locale::~locale(local_1048);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8," 15","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_aa8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_aa8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_aa8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xffffff4f | 0x80;
  *(undefined8 *)
   ((long)&result[0]._M_string_length + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\x0f') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(15)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_1040);
  std::locale::~locale(local_1040);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  *(undefined8 *)
   ((long)&result[0]._M_dataplus._M_p + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xfffffefb | 4;
  std::wostream::_M_insert<double>(13.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"13.100","");
  std::locale::locale(local_aa0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_aa0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_aa0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"13.100\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1038);
  std::locale::~locale(local_1038);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"13.100","");
  std::locale::locale(local_a98,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a98);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a98);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  *(undefined8 *)
   ((long)&result[0]._M_dataplus._M_p + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xfffffefb | 4;
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 13.1) || (NAN((double)format_string.field_2._8_8_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(13.1)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1030);
  std::locale::~locale(local_1030);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"13.100","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_a90,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a90);
  psVar3 = &result[0]._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a90);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  *(undefined8 *)
   ((long)&result[0]._M_dataplus._M_p + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 3;
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xfffffefb | 4;
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 13.1) || (NAN((double)format_string.field_2._8_8_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(13.1)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&expected_f[3].field_2 + 8),"");
  std::locale::locale(local_a88,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a88);
  std::locale::~locale(local_a88);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1028);
  std::locale::~locale(local_1028);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::operator>>((wistream *)(expected_f[3].field_2._M_local_buf + 8),(int *)local_b8);
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x116);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1020);
  std::locale::~locale(local_1020);
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)(expected_f[3].field_2._M_local_buf + 8),(int *)local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x116);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"--3","");
  std::locale::locale(local_a80,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a80);
  std::locale::~locale(local_a80);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1018);
  std::locale::~locale(local_1018);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::operator>>((wistream *)(expected_f[3].field_2._M_local_buf + 8),(int *)local_b8);
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x117);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1010);
  std::locale::~locale(local_1010);
  psVar3 = &result[0]._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)(expected_f[3].field_2._M_local_buf + 8),(int *)local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x117);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"y","");
  std::locale::locale(local_a78,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a78);
  std::locale::~locale(local_a78);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1008);
  std::locale::~locale(local_1008);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::operator>>((wistream *)(expected_f[3].field_2._M_local_buf + 8),(int *)local_b8);
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1000);
  std::locale::~locale(local_1000);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)(expected_f[3].field_2._M_local_buf + 8),(int *)local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x118);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_ff8);
  std::locale::~locale(local_ff8);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<double>(0.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"10%","");
  std::locale::locale(local_a70,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_a70);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_a70);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"10%\",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ff0);
  std::locale::~locale(local_ff0);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"10%","");
  std::locale::locale(local_a68,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a68);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a68);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 0.1) || (NAN((double)format_string.field_2._8_8_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(0.1)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fe8);
  std::locale::~locale(local_fe8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"10%","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_a60,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a60);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a60);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 0.1) || (NAN((double)format_string.field_2._8_8_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(0.1)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_fe0);
  std::locale::~locale(local_fe0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xfffffefb | 4;
  *(undefined8 *)
   ((long)&result[0]._M_dataplus._M_p + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 1;
  std::wostream::_M_insert<double>(0.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"10.0%","");
  std::locale::locale(local_a58,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_a58);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_a58);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"10.0%\",loc))",0x37);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fd8);
  std::locale::~locale(local_fd8);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"10.0%","");
  std::locale::locale(local_a50,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a50);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a50);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xfffffefb | 4;
  *(undefined8 *)
   ((long)&result[0]._M_dataplus._M_p + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 1;
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 0.1) || (NAN((double)format_string.field_2._8_8_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(0.1)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fd0);
  std::locale::~locale(local_fd0);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"10.0%","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_a48,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a48);
  psVar3 = &result[0]._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a48);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) &
       0xfffffefb | 4;
  *(undefined8 *)
   ((long)&result[0]._M_dataplus._M_p + *(long *)(expected_f[3].field_2._8_8_ + -0x18)) = 1;
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 0.1) || (NAN((double)format_string.field_2._8_8_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(0.1)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"1","");
  std::locale::locale(local_a40,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a40);
  std::locale::~locale(local_a40);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fc8);
  std::locale::~locale(local_fc8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fc0);
  std::locale::~locale(local_fc0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_fb8);
  std::locale::~locale(local_fb8);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"$1,345.00","");
  std::locale::locale(local_a38,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_a38);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_a38);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"$1,345.00\",loc))",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fb0);
  std::locale::~locale(local_fb0);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"$1,345.00","");
  std::locale::locale(local_a30,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a30);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a30);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'Ձ') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fa8);
  std::locale::~locale(local_fa8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"$1,345.00","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_a28,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a28);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a28);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'Ձ') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_fa0);
  std::locale::~locale(local_fa0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"$1,345.34","");
  std::locale::locale(local_a20,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_a20);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_a20);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"$1,345.34\",loc))",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f98);
  std::locale::~locale(local_f98);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"$1,345.34","");
  std::locale::locale(local_a18,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a18);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a18);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1345.34) || (NAN((double)format_string.field_2._8_8_))
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f90);
  std::locale::~locale(local_f90);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"$1,345.34","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_a10,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_a10);
  psVar3 = &result[0]._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_a10);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1345.34) || (NAN((double)format_string.field_2._8_8_))
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"$","");
  std::locale::locale(local_a08,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a08);
  std::locale::~locale(local_a08);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f88);
  std::locale::~locale(local_f88);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x122);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f80);
  std::locale::~locale(local_f80);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x122);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_f78);
  std::locale::~locale(local_f78);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"$1,345.00","");
  std::locale::locale(local_a00,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_a00);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_a00);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"$1,345.00\",loc))",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f70);
  std::locale::~locale(local_f70);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"$1,345.00","");
  std::locale::locale(local_9f8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_9f8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_9f8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::currency_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'Ձ') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f68);
  std::locale::~locale(local_f68);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"$1,345.00","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_9f0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_9f0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_9f0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::currency_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'Ձ') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_f60);
  std::locale::~locale(local_f60);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar9);
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"$1,345.34","");
  std::locale::locale(local_9e8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_9e8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_9e8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"$1,345.34\",loc))",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f58);
  std::locale::~locale(local_f58);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"$1,345.34","");
  std::locale::locale(local_9e0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_9e0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_9e0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::currency_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1345.34) || (NAN((double)format_string.field_2._8_8_))
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f50);
  std::locale::~locale(local_f50);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"$1,345.34","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_9d8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_9d8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_9d8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::currency_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1345.34) || (NAN((double)format_string.field_2._8_8_))
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_f48);
  std::locale::~locale(local_f48);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"USD1,345.00","");
  std::locale::locale(local_9d0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_9d0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_9d0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"USD1,345.00\",loc))",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f40);
  std::locale::~locale(local_f40);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"USD1,345.00","");
  std::locale::locale(local_9c8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_9c8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_9c8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::currency_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'Ձ') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f38);
  std::locale::~locale(local_f38);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"USD1,345.00","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_9c0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_9c0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_9c0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::currency_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'Ձ') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_f30);
  std::locale::~locale(local_f30);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar9);
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"USD1,345.34","");
  std::locale::locale(local_9b8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_9b8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_9b8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"USD1,345.34\",loc))",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f28);
  std::locale::~locale(local_f28);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"USD1,345.34","");
  std::locale::locale(local_9b0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_9b0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_9b0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::currency_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1345.34) || (NAN((double)format_string.field_2._8_8_))
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f20);
  std::locale::~locale(local_f20);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"USD1,345.34","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_9a8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_9a8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_9a8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::currency_flags(uVar9);
  pwVar11 = std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)format_string.field_2._8_8_ != 1345.34) || (NAN((double)format_string.field_2._8_8_))
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_f18);
  std::locale::~locale(local_f18);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),10);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ten","");
  std::locale::locale(local_9a0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_9a0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_9a0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"ten\",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f10);
  std::locale::~locale(local_f10);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"ten","");
  std::locale::locale(local_998,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_998);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_998);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\n') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(10)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f08);
  std::locale::~locale(local_f08);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ten","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_990,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_990);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_990);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  pwVar11 = (wistream *)
            std::wistream::operator>>
                      ((wistream *)(expected_f[3].field_2._M_local_buf + 8),
                       format_string.field_2._M_local_buf + 2);
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._M_local_buf[2] != L'\n') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(10)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wostringstream::wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::wios::imbue(local_f00);
  std::locale::~locale(local_f00);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  std::wostream::operator<<((wostream *)(expected_f[3].field_2._M_local_buf + 8),1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"1st","");
  std::locale::locale(local_988,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_988);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_988);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x131);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"1st\",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_ef8);
  std::locale::~locale(local_ef8);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Feb 5, 1970","");
  std::locale::locale(local_980,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_980);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_980);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\",loc))",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ef0);
  std::locale::~locale(local_ef0);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"Feb 5, 1970","");
  std::locale::locale(local_978,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_978);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_978);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ee8);
  std::locale::~locale(local_ee8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Feb 5, 1970","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_970,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_970);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_970);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_ee0);
  std::locale::~locale(local_ee0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"2/5/70","");
  std::locale::locale(local_968,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_968);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_968);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"2/5/70\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ed8);
  std::locale::~locale(local_ed8);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"2/5/70","");
  std::locale::locale(local_960,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_960);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_960);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ed0);
  std::locale::~locale(local_ed0);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"2/5/70","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_958,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_958);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_958);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_ec8);
  std::locale::~locale(local_ec8);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Feb 5, 1970","");
  std::locale::locale(local_950,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_950);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_950);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\",loc))",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ec0);
  std::locale::~locale(local_ec0);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"Feb 5, 1970","");
  std::locale::locale(local_948,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_948);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_948);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_eb8);
  std::locale::~locale(local_eb8);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Feb 5, 1970","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_940,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_940);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_940);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_eb0);
  std::locale::~locale(local_eb0);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"February 5, 1970","");
  std::locale::locale(local_938,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_938);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_938);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"February 5, 1970\",loc))",0x42);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ea8);
  std::locale::~locale(local_ea8);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"February 5, 1970","");
  std::locale::locale(local_930,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_930);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_930);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ea0);
  std::locale::~locale(local_ea0);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"February 5, 1970","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_928,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_928);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_928);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_e98);
  std::locale::~locale(local_e98);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"Thursday, February 5, 1970","");
  std::locale::locale(local_920,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_920);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_920);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " (ss.str())==(to_correct_string<CharType>(\"Thursday, February 5, 1970\",loc))",0x4c
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e90);
  std::locale::~locale(local_e90);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"Thursday, February 5, 1970","");
  std::locale::locale(local_918,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_918);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_918);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e88);
  std::locale::~locale(local_e88);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"Thursday, February 5, 1970","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_910,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_910);
  psVar3 = &result[0]._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_910);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"aa/bb/cc","");
  std::locale::locale(local_908,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_908);
  std::locale::~locale(local_908);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e80);
  std::locale::~locale(local_e80);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e78);
  std::locale::~locale(local_e78);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::date_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x13f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar17,(string *)local_338);
    __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_e70);
  std::locale::~locale(local_e70);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"3:33:13 PM","");
  std::locale::locale(local_900,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_900);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_900);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM\",loc))",0x3c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e68);
  std::locale::~locale(local_e68);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"3:33:13 PM","");
  std::locale::locale(local_8f8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_8f8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_8f8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e60);
  std::locale::~locale(local_e60);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"3:33:13 PM","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_8f0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_8f0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_8f0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_e58);
  std::locale::~locale(local_e58);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"3:33 PM","");
  std::locale::locale(local_8e8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_8e8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_8e8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"3:33 PM\",loc))",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e50);
  std::locale::~locale(local_e50);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"3:33 PM","");
  std::locale::locale(local_8e0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_8e0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_8e0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdaac) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e48);
  std::locale::~locale(local_e48);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"3:33 PM","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_8d8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_8d8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_8d8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdaac) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_e40);
  std::locale::~locale(local_e40);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"3:33:13 PM","");
  std::locale::locale(local_8d0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_8d0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_8d0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM\",loc))",0x3c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e38);
  std::locale::~locale(local_e38);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"3:33:13 PM","");
  std::locale::locale(local_8c8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_8c8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_8c8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e30);
  std::locale::~locale(local_e30);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"3:33:13 PM","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_8c0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_8c0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_8c0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_e28);
  std::locale::~locale(local_e28);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"3:33:13 PM GMT","");
  std::locale::locale(local_8b8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_8b8);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_8b8);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM GMT\",loc))",0x40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e20);
  std::locale::~locale(local_e20);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"3:33:13 PM GMT","");
  std::locale::locale(local_8b0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_8b0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_8b0);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e18);
  std::locale::~locale(local_e18);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"3:33:13 PM GMT","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_8a8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_8a8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_8a8);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar4);
  std::wios::imbue(local_e10);
  std::locale::~locale(local_e10);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"3:33:13 PM Greenwich Mean Time","");
  std::locale::locale(local_8a0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_338
             ,(string *)local_b8,local_8a0);
  if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
    if (act._M_dataplus._M_p == (pointer)0x0) {
      bVar22 = true;
    }
    else {
      iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
      bVar22 = iVar8 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  std::locale::~locale(local_8a0);
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  if (!bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM \" \"Greenwich Mean Time\",loc))"
               ,0x53);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e08);
  std::locale::~locale(local_e08);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"3:33:13 PM Greenwich Mean Time","");
  std::locale::locale(local_898,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_898);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_898);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e00);
  std::locale::~locale(local_e00);
  local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"3:33:13 PM Greenwich Mean Time","");
  plVar12 = (long *)std::__cxx11::string::append(local_b8);
  pwVar18 = (wchar_t *)(plVar12 + 2);
  if ((wchar_t *)*plVar12 == pwVar18) {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_time_str._16_8_ = plVar12[3];
    local_338 = (undefined1  [8])pwVar1;
  }
  else {
    local_time_str._8_8_ = *(undefined8 *)pwVar18;
    local_338 = (undefined1  [8])*plVar12;
  }
  local_time_str._0_8_ = plVar12[1];
  *plVar12 = (long)pwVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::locale::locale(local_890,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)local_338,local_890);
  psVar3 = &result[0]._M_string_length;
  std::__cxx11::wstringbuf::str((wstring *)psVar3);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  std::locale::~locale(local_890);
  if (local_338 != (undefined1  [8])pwVar1) {
    operator_delete((void *)local_338);
  }
  if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
    operator_delete((void *)local_b8);
  }
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::time_flags(uVar9);
  psVar13 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  act._M_string_length._0_4_ = 0x544d47;
  act._M_dataplus._M_p = (pointer)0x3;
  local_230 = (undefined1  [8])psVar2;
  booster::locale::ios_info::time_zone(psVar13);
  if (local_230 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_230);
  }
  pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
  *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
       *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar11,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (format_string.field_2._8_8_ != 0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (local_338._0_4_ != L'@') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_230);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  expected_f[3].field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expected_f[3].field_2 + 8),"AM","");
  std::locale::locale(local_888,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_888);
  std::locale::~locale(local_888);
  if ((size_type *)expected_f[3].field_2._8_8_ != psVar3) {
    operator_delete((void *)expected_f[3].field_2._8_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_df8);
  std::locale::~locale(local_df8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 5U) == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x155);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar22 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar22) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338 = (undefined1  [8])pwVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar17,(string *)local_338);
      __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream
            ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
  std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_df0);
  std::locale::~locale(local_df0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  lVar16 = *(long *)(expected_f[3].field_2._8_8_ + -0x18);
  *(undefined4 *)((long)&result[0].field_2 + lVar16 + 4) = 4;
  std::wios::clear((int)lVar16 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar9 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&expected_f[3].field_2 +
                     *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
  booster::locale::ios_info::display_flags(uVar9);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)((long)&expected_f[3].field_2 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x155);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (error_counter < 0x15) {
    error_counter = error_counter + 1;
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_de8);
    std::locale::~locale(local_de8);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar13);
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33:13 PM","");
    std::locale::locale(local_880,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_880);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_880);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM\",loc))",0x3c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_de0);
    std::locale::~locale(local_de0);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33:13 PM","");
    std::locale::locale(local_878,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_878);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_878);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_dd8);
    std::locale::~locale(local_dd8);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33:13 PM","");
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_870,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_870);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_870);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_dd0);
    std::locale::~locale(local_dd0);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar13);
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33 PM","");
    std::locale::locale(local_868,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_868);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_868);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," (ss.str())==(to_correct_string<CharType>(\"4:33 PM\",loc))",0x39);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_dc8);
    std::locale::~locale(local_dc8);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33 PM","");
    std::locale::locale(local_860,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_860);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_860);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdaac) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time)",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_dc0);
    std::locale::~locale(local_dc0);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33 PM","");
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_858,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_858);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_858);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdaac) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time)",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_db8);
    std::locale::~locale(local_db8);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar13);
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33:13 PM","");
    std::locale::locale(local_850,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_850);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_850);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM\",loc))",0x3c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_db0);
    std::locale::~locale(local_db0);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33:13 PM","");
    std::locale::locale(local_848,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_848);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_848);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_da8);
    std::locale::~locale(local_da8);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33:13 PM","");
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_840,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_840);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_840);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_da0);
    std::locale::~locale(local_da0);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar13);
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33:13 PM GMT+1","");
    std::locale::locale(local_838,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_838);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_838);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM \" \"GMT+1\",loc))"
                 ,0x45);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d98);
    std::locale::~locale(local_d98);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33:13 PM GMT+1","");
    std::locale::locale(local_830,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_830);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_830);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d90);
    std::locale::~locale(local_d90);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33:13 PM GMT+1","");
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_828,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_828);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_828);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_d88);
    std::locale::~locale(local_d88);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar13);
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33:13 PM GMT+01:00","");
    std::locale::locale(local_820,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_820);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_820);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM GMT+01:00\",loc))",
                 0x46);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d80);
    std::locale::~locale(local_d80);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33:13 PM GMT+01:00","");
    std::locale::locale(local_818,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_818);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_818);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d78);
    std::locale::~locale(local_d78);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4:33:13 PM GMT+01:00","");
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_810,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_810);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_810);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    act._M_dataplus._M_p = (pointer)0x0;
    act._M_string_length._0_4_ = (uint)act._M_string_length & 0xffffff00;
    local_230 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x187e3a);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_zone(psVar13);
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_d70);
    std::locale::~locale(local_d70);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Feb 5, 1970, 3:33:13 PM","")
    ;
    std::locale::locale(local_808,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_808);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_808);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                 ,0x4f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d68);
    std::locale::~locale(local_d68);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Feb 5, 1970, 3:33:13 PM","");
    std::locale::locale(local_800,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_800);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_800);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d60);
    std::locale::~locale(local_d60);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Feb 5, 1970, 3:33:13 PM","")
    ;
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_7f8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_7f8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_7f8);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_d58);
    std::locale::~locale(local_d58);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"2/5/70, 3:33 PM","");
    std::locale::locale(local_7f0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_7f0);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_7f0);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 " (ss.str())==(to_correct_string<CharType>(\"2/5/70\" \",\" \" 3:33 PM\",loc))",
                 0x47);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d50);
    std::locale::~locale(local_d50);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"2/5/70, 3:33 PM","");
    std::locale::locale(local_7e8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_7e8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_7e8);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff2c) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date+a_time)",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d48);
    std::locale::~locale(local_d48);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"2/5/70, 3:33 PM","");
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_7e0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_7e0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_7e0);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff2c) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_date+a_time)",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_d40);
    std::locale::~locale(local_d40);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Feb 5, 1970, 3:33:13 PM","")
    ;
    std::locale::locale(local_7d8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_7d8);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_7d8);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                 ,0x4f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d38);
    std::locale::~locale(local_d38);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Feb 5, 1970, 3:33:13 PM","");
    std::locale::locale(local_7d0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_7d0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_7d0);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d30);
    std::locale::~locale(local_d30);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Feb 5, 1970, 3:33:13 PM","")
    ;
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_7c8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_7c8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_7c8);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_d28);
    std::locale::~locale(local_d28);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"February 5, 1970 at 3:33:13 PM GMT","");
    std::locale::locale(local_7c0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_7c0);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_7c0);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 " (ss.str())==(to_correct_string<CharType>(\"February 5, 1970\" \" at\" \" 3:33:13 PM GMT\",loc))"
                 ,0x5a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d20);
    std::locale::~locale(local_d20);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"February 5, 1970 at 3:33:13 PM GMT","");
    std::locale::locale(local_7b8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_7b8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_7b8);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d18);
    std::locale::~locale(local_d18);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"February 5, 1970 at 3:33:13 PM GMT","");
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_7b0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_7b0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_7b0);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_d10);
    std::locale::~locale(local_d10);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time","")
    ;
    std::locale::locale(local_7a8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_338,(string *)local_b8,local_7a8);
    if (act._M_dataplus._M_p == (pointer)local_time_str._0_8_) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_338,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    std::locale::~locale(local_7a8);
    if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 " (ss.str())==(to_correct_string<CharType>(\"Thursday, February 5, 1970\" \" at\" \" 3:33:13 PM \" \"Greenwich Mean Time\",loc))"
                 ,0x77);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d08);
    std::locale::~locale(local_d08);
    local_338 = (undefined1  [8])pwVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",""
              );
    std::locale::locale(local_7a0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_7a0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_7a0);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar11);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8] & 2U) ==
        0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d00);
    std::locale::~locale(local_d00);
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time","")
    ;
    plVar12 = (long *)std::__cxx11::string::append(local_b8);
    pwVar18 = (wchar_t *)(plVar12 + 2);
    if ((wchar_t *)*plVar12 == pwVar18) {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_time_str._16_8_ = plVar12[3];
      local_338 = (undefined1  [8])pwVar1;
    }
    else {
      local_time_str._8_8_ = *(undefined8 *)pwVar18;
      local_338 = (undefined1  [8])*plVar12;
    }
    local_time_str._0_8_ = plVar12[1];
    *plVar12 = (long)pwVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::locale::locale(local_798,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)local_338,local_798);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::locale::~locale(local_798);
    if (local_338 != (undefined1  [8])pwVar1) {
      operator_delete((void *)local_338);
    }
    psVar3 = &sample_f[0]._M_string_length;
    if (local_b8 != (undefined1  [8])psVar3) {
      operator_delete((void *)local_b8);
    }
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::display_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::date_flags(uVar9);
    uVar9 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((long)&expected_f[3].field_2 +
                       *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    booster::locale::ios_info::time_flags(uVar9);
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((long)&expected_f[3].field_2 +
                         *(long *)(expected_f[3].field_2._8_8_ + -0x18) + 8));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    pwVar11 = std::wistream::_M_extract<long>((long *)(expected_f[3].field_2._M_local_buf + 8));
    *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
         *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar11,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (format_string.field_2._8_8_ != 0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (local_338._0_4_ != L'@') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)result[3].field_2._M_local_buf);
    tVar14 = time((time_t *)0x0);
    local_cf8 = tVar14 + 0x3840;
    local_748 = &format._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"%H:%M:%S","");
    format.field_2._8_8_ = &format_string._M_string_length;
    std::__cxx11::wstring::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((wstring *)((long)&format.field_2 + 8),local_748,
               format._M_dataplus._M_p + (long)local_748);
    __format = local_748;
    __tp = gmtime(&local_cf8);
    strftime(local_338,0x100,(char *)__format,__tp);
    std::__cxx11::wostringstream::wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::wios::imbue((locale *)&lnow);
    std::locale::~locale((locale *)&lnow);
    booster::locale::as::ftime<wchar_t>
              ((add_ftime<wchar_t> *)local_230,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&format.field_2 + 8));
    booster::locale::as::details::add_ftime<wchar_t>::apply
              ((add_ftime<wchar_t> *)local_230,
               (basic_ios<wchar_t,_std::char_traits<wchar_t>_> *)
               ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8) +
               *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    format_string.field_2._8_8_ = &expected_f[0]._M_string_length;
    sVar15 = strlen(local_338);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&format_string.field_2 + 8),local_338,local_time_str + (sVar15 - 8))
    ;
    std::locale::locale(local_790,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_b8,(string *)((long)&format_string.field_2 + 8),local_790);
    if (act._M_dataplus._M_p == (pointer)sample_f[0]._M_dataplus._M_p) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_b8,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_b8 != (undefined1  [8])psVar3) {
      operator_delete((void *)local_b8);
    }
    std::locale::~locale(local_790);
    if ((size_type *)format_string.field_2._8_8_ != &expected_f[0]._M_string_length) {
      operator_delete((void *)format_string.field_2._8_8_);
    }
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x185);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))",0x3e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])psVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    pwVar4 = (wostringstream *)(expected_f[3].field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar4);
    std::wios::imbue(local_ce8);
    std::locale::~locale(local_ce8);
    booster::locale::as::ftime<wchar_t>
              ((add_ftime<wchar_t> *)local_b8,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&format.field_2 + 8));
    booster::locale::as::details::add_ftime<wchar_t>::apply
              ((add_ftime<wchar_t> *)local_b8,
               (basic_ios<wchar_t,_std::char_traits<wchar_t>_> *)
               (pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    act._M_string_length._0_4_ = 0x544d47;
    act._M_dataplus._M_p = (pointer)0x3;
    local_230 = (undefined1  [8])psVar2;
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    psVar13 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(pwVar4 + *(long *)(expected_f[3].field_2._8_8_ + -0x18)));
    booster::locale::time_zone::global_abi_cxx11_();
    booster::locale::ios_info::time_zone(psVar13);
    if (local_230 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_230);
    }
    std::wostream::_M_insert<long>((long)((long)&expected_f[3].field_2 + 8));
    if (local_b8 != (undefined1  [8])psVar3) {
      operator_delete((void *)local_b8);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    format_string.field_2._8_8_ = &expected_f[0]._M_string_length;
    sVar15 = strlen(local_338);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&format_string.field_2 + 8),local_338,local_time_str + (sVar15 - 8))
    ;
    std::locale::locale(local_788,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_b8,(string *)((long)&format_string.field_2 + 8),local_788);
    if (act._M_dataplus._M_p == (pointer)sample_f[0]._M_dataplus._M_p) {
      if (act._M_dataplus._M_p == (pointer)0x0) {
        bVar22 = true;
      }
      else {
        iVar8 = wmemcmp((wchar_t *)local_230,(wchar_t *)local_b8,(size_t)act._M_dataplus._M_p);
        bVar22 = iVar8 == 0;
      }
    }
    else {
      bVar22 = false;
    }
    if (local_b8 != (undefined1  [8])psVar3) {
      operator_delete((void *)local_b8);
    }
    std::locale::~locale(local_788);
    if ((size_type *)format_string.field_2._8_8_ != &expected_f[0]._M_string_length) {
      operator_delete((void *)format_string.field_2._8_8_);
    }
    if (local_230 != (undefined1  [8])&act._M_string_length) {
      operator_delete((void *)local_230);
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x186);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))",0x3e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar22 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar22) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230 = (undefined1  [8])&act._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar17,(string *)local_230);
        __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(expected_f[3].field_2._M_local_buf + 8));
    std::ios_base::~ios_base((ios_base *)&result[3]._M_string_length);
    local_cd0 = &marks._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_cd0,"aAbBcdehHIjmMnprRStTxXyYZ%","");
    expected_f[3].field_2._8_8_ = &result[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&expected_f[3].field_2 + 8),"Thu","");
    result[0].field_2._8_8_ = &result[1]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0].field_2 + 8),"Thursday","");
    result[1].field_2._8_8_ = &result[2]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[1].field_2 + 8),"Feb","");
    result[2].field_2._8_8_ = &result[3]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[2].field_2 + 8),"February","");
    result[3].field_2._8_8_ = &result[4]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[3].field_2 + 8),
               "Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time","");
    result[4].field_2._8_8_ = &result[5]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[4].field_2 + 8),"05","");
    result[5].field_2._8_8_ = &result[6]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&result[5].field_2 + 8),"5","")
    ;
    result[6].field_2._8_8_ = &result[7]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[6].field_2 + 8),"Feb","");
    result[7].field_2._8_8_ = &result[8]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[7].field_2 + 8),"15","");
    result[8].field_2._8_8_ = &result[9]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[8].field_2 + 8),"03","");
    result[9].field_2._8_8_ = &result[10]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[9].field_2 + 8),"36","");
    result[10].field_2._8_8_ = &result[0xb]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[10].field_2 + 8),"02","");
    result[0xb].field_2._8_8_ = &result[0xc]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0xb].field_2 + 8),"33","");
    result[0xc].field_2._8_8_ = &result[0xd]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0xc].field_2 + 8),"\n","");
    result[0xd].field_2._8_8_ = &result[0xe]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0xd].field_2 + 8),"PM","");
    result[0xe].field_2._8_8_ = &result[0xf]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0xe].field_2 + 8),"03:33:13 PM","");
    result[0xf].field_2._8_8_ = &result[0x10]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0xf].field_2 + 8),"15:33","");
    result[0x10].field_2._8_8_ = &result[0x11]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x10].field_2 + 8),"13","");
    result[0x11].field_2._8_8_ = &result[0x12]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x11].field_2 + 8),"\t","");
    result[0x12].field_2._8_8_ = &result[0x13]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x12].field_2 + 8),"15:33:13","");
    result[0x13].field_2._8_8_ = &result[0x14]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x13].field_2 + 8),"Feb 5, 1970","");
    result[0x14].field_2._8_8_ = &result[0x15]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x14].field_2 + 8),"3:33:13 PM","");
    result[0x15].field_2._8_8_ = &result[0x16]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x15].field_2 + 8),"70","");
    result[0x16].field_2._8_8_ = &result[0x17]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x16].field_2 + 8),"1970","");
    result[0x17].field_2._8_8_ = &result[0x18]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x17].field_2 + 8),"Greenwich Mean Time","");
    result[0x18].field_2._8_8_ = &result[0x19]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&result[0x18].field_2 + 8),"%","");
    if (marks._M_dataplus._M_p != (pointer)0x0) {
      uVar19 = 1;
      pcVar21 = (pointer)0x0;
      do {
        wVar20 = (int)&format + L'\x18';
        format_string._M_dataplus._M_p = (pointer)0x0;
        *(undefined4 *)format.field_2._8_8_ = 0;
        std::__cxx11::wstring::push_back(wVar20);
        std::__cxx11::wstring::push_back(wVar20);
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_230);
        std::wios::imbue(local_ce0);
        std::locale::~locale(local_ce0);
        paVar5 = (add_ftime<wchar_t> *)((long)&format_string.field_2 + 8);
        booster::locale::as::ftime<wchar_t>
                  (paVar5,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)((long)&format.field_2 + 8));
        booster::locale::as::details::add_ftime<wchar_t>::apply
                  (paVar5,(basic_ios<wchar_t,_std::char_traits<wchar_t>_> *)
                          ((wostringstream *)local_230 + *(long *)((long)local_230 + -0x18)));
        psVar13 = (string *)
                  booster::locale::ios_info::get
                            ((ios_base *)
                             ((wostringstream *)local_230 + *(long *)((long)local_230 + -0x18)));
        sample_f[0]._M_string_length._2_1_ = 0x54;
        sample_f[0]._M_string_length._0_2_ = 0x4d47;
        sample_f[0]._M_dataplus._M_p = (pointer)0x3;
        sample_f[0]._M_string_length._3_1_ = 0;
        local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
        booster::locale::ios_info::time_zone(psVar13);
        if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
          operator_delete((void *)local_b8);
        }
        std::wostream::_M_insert<long>((long)local_230);
        if ((size_type *)format_string.field_2._8_8_ != &expected_f[0]._M_string_length) {
          operator_delete((void *)format_string.field_2._8_8_);
        }
        test_counter = test_counter + 1;
        std::__cxx11::wstringbuf::str();
        std::locale::locale(local_780,(locale *)(sample_f[3].field_2._M_local_buf + 8));
        to_correct_string<wchar_t>
                  ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   ((long)&format_string.field_2 + 8),
                   (string *)((long)&expected_f[(long)(pcVar21 + 3)].field_2 + 8),local_780);
        if (sample_f[0]._M_dataplus._M_p == expected_f[0]._M_dataplus._M_p) {
          if (sample_f[0]._M_dataplus._M_p == (pointer)0x0) {
            bVar22 = true;
          }
          else {
            iVar8 = wmemcmp((wchar_t *)local_b8,(wchar_t *)format_string.field_2._8_8_,
                            (size_t)sample_f[0]._M_dataplus._M_p);
            bVar22 = iVar8 == 0;
          }
        }
        else {
          bVar22 = false;
        }
        if ((size_type *)format_string.field_2._8_8_ != &expected_f[0]._M_string_length) {
          operator_delete((void *)format_string.field_2._8_8_);
        }
        std::locale::~locale(local_780);
        if (local_b8 != (undefined1  [8])&sample_f[0]._M_string_length) {
          operator_delete((void *)local_b8);
        }
        if (!bVar22) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," (ss.str())==(to_correct_string<CharType>(result[i],loc))",0x39);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          iVar8 = error_counter + 1;
          bVar22 = 0x14 < error_counter;
          error_counter = iVar8;
          if (bVar22) {
            prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar17,(string *)local_b8);
            __cxa_throw(prVar17,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_230);
        std::ios_base::~ios_base(local_1c0);
        pcVar21 = (pointer)(ulong)uVar19;
        uVar19 = uVar19 + 1;
      } while (pcVar21 < marks._M_dataplus._M_p);
    }
    local_b8 = (undefined1  [8])&sample_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Now is %A, %H o\'clo\'\'ck \' or not \' ","");
    sample_f[0].field_2._8_8_ = &sample_f[1]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&sample_f[0].field_2 + 8),"\'test %H\'","");
    sample_f[1].field_2._8_8_ = &sample_f[2]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&sample_f[1].field_2 + 8),"%H\'","");
    sample_f[2].field_2._8_8_ = &sample_f[3]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&sample_f[2].field_2 + 8),"\'%H\'","");
    format_string.field_2._8_8_ = &expected_f[0]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&format_string.field_2 + 8),
               "Now is Thursday, 15 o\'clo\'\'ck \' or not \' ","");
    expected_f[0].field_2._8_8_ = &expected_f[1]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&expected_f[0].field_2 + 8),"\'test 15\'","");
    expected_f[1].field_2._8_8_ = &expected_f[2]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&expected_f[1].field_2 + 8),"15\'","");
    expected_f[2].field_2._8_8_ = &expected_f[3]._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&expected_f[2].field_2 + 8),"\'15\'","");
    lVar16 = 0;
    do {
      lVar6 = *(long *)((long)sample_f + lVar16 + -8);
      std::__cxx11::wstring::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((wstring *)((long)&format.field_2 + 8),format.field_2._8_8_,
                 format.field_2._8_8_ + (long)format_string._M_dataplus._M_p * 4,lVar6,
                 *(long *)((long)&sample_f[0]._M_dataplus._M_p + lVar16) + lVar6);
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_230);
      std::wios::imbue(local_cd8);
      std::locale::~locale(local_cd8);
      paVar5 = (add_ftime<wchar_t> *)((long)&marks.field_2 + 8);
      booster::locale::as::ftime<wchar_t>
                (paVar5,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                         *)((long)&format.field_2 + 8));
      booster::locale::as::details::add_ftime<wchar_t>::apply
                (paVar5,(basic_ios<wchar_t,_std::char_traits<wchar_t>_> *)
                        ((wostringstream *)local_230 + *(long *)((long)local_230 + -0x18)));
      psVar13 = (string *)
                booster::locale::ios_info::get
                          ((ios_base *)
                           ((wostringstream *)local_230 + *(long *)((long)local_230 + -0x18)));
      local_758._M_local_buf[2] = 'T';
      local_758._M_allocated_capacity._0_2_ = 0x4d47;
      local_758._M_local_buf[3] = '\0';
      _g = (pointer)&local_758;
      booster::locale::ios_info::time_zone(psVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_g != &local_758) {
        operator_delete(_g);
      }
      std::wostream::_M_insert<long>((long)local_230);
      if ((undefined1 *)marks.field_2._8_8_ != local_ca0) {
        operator_delete((void *)marks.field_2._8_8_);
      }
      test_counter = test_counter + 1;
      std::__cxx11::wstringbuf::str();
      std::locale::locale(local_778,(locale *)(sample_f[3].field_2._M_local_buf + 8));
      to_correct_string<wchar_t>
                ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 ((long)&marks.field_2 + 8),(string *)((long)expected_f + lVar16 + -8),local_778);
      if (local_ca8 == 3) {
        iVar8 = wmemcmp((wchar_t *)_g,(wchar_t *)marks.field_2._8_8_,3);
        bVar22 = iVar8 == 0;
      }
      else {
        bVar22 = false;
      }
      if ((undefined1 *)marks.field_2._8_8_ != local_ca0) {
        operator_delete((void *)marks.field_2._8_8_);
      }
      std::locale::~locale(local_778);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_g != &local_758) {
        operator_delete(_g);
      }
      if (!bVar22) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x1ba);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," (ss.str())==(to_correct_string<CharType>(expected_f[i],loc))",0x3d);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        iVar8 = error_counter + 1;
        bVar22 = 0x14 < error_counter;
        error_counter = iVar8;
        if (bVar22) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
          _g = (pointer)&local_758;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&g,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar17,(string *)&g);
          __cxa_throw(prVar17,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_230);
      std::ios_base::~ios_base(local_1c0);
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x80);
    lVar16 = 0;
    do {
      pvVar7 = *(void **)((long)&expected_f[2].field_2 + lVar16 + 8);
      if ((void *)((long)&expected_f[3]._M_string_length + lVar16) != pvVar7) {
        operator_delete(pvVar7);
      }
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != -0x80);
    lVar16 = 0;
    do {
      pvVar7 = *(void **)((long)&sample_f[2].field_2 + lVar16 + 8);
      if ((void *)((long)&sample_f[3]._M_string_length + lVar16) != pvVar7) {
        operator_delete(pvVar7);
      }
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != -0x80);
    lVar16 = 0;
    do {
      pvVar7 = *(void **)((long)&result[0x18].field_2 + lVar16 + 8);
      if ((void *)((long)&result[0x19]._M_string_length + lVar16) != pvVar7) {
        operator_delete(pvVar7);
      }
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != -0x340);
    if (local_cd0 != &marks._M_string_length) {
      operator_delete(local_cd0);
    }
    if ((size_type *)format.field_2._8_8_ != &format_string._M_string_length) {
      operator_delete((void *)format.field_2._8_8_);
    }
    if (local_748 != &format._M_string_length) {
      operator_delete(local_748);
    }
    std::locale::~locale((locale *)(sample_f[3].field_2._M_local_buf + 8));
    booster::locale::generator::~generator(local_770);
    return;
  }
  error_counter = error_counter + 1;
  prVar17 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_338 = (undefined1  [8])pwVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"Error limits reached, stopping unit test","");
  booster::runtime_error::runtime_error(prVar17,(string *)local_338);
  __cxa_throw(prVar17,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_manip(std::string e_charset="UTF-8")
{
    booster::locale::generator g;
    std::locale loc=g("en_US."+e_charset);
    
    TEST_FP1(as::posix,1200.1,"1200.1",double,1200.1);
    TEST_FP1(as::number,1200.1,"1,200.1",double,1200.1);
    TEST_FMT(as::number<<std::setfill(CharType('_'))<<std::setw(6),1534,"_1,534");
    TEST_FMT(as::number<<std::left<<std::setfill(CharType('_'))<<std::setw(6),1534,"1,534_");
    
    // Ranges
    if(sizeof(short) == 2) {
        TEST_MIN_MAX(short,"-32,768","32,767");
        TEST_MIN_MAX(unsigned short,"0","65,535");
        TEST_NOPAR(as::number,"-1",unsigned short);
        if(short_parsing_fails()) {
            TEST_NOPAR(as::number,"65,535",short);
        }
    }
    if(sizeof(int)==4) {
        TEST_MIN_MAX(int,"-2,147,483,648","2,147,483,647");
        TEST_MIN_MAX(unsigned int,"0","4,294,967,295");
        TEST_NOPAR(as::number,"-1",unsigned int);
        TEST_NOPAR(as::number,"4,294,967,295",int);
    }
    if(sizeof(long)==4) {
        TEST_MIN_MAX(long,"-2,147,483,648","2,147,483,647");
        TEST_MIN_MAX(unsigned long,"0","4,294,967,295");
        TEST_NOPAR(as::number,"-1",unsigned long);
        TEST_NOPAR(as::number,"4,294,967,295",long);
    }
    if(sizeof(long)==8) {
        TEST_MIN_MAX(long,"-9,223,372,036,854,775,808","9,223,372,036,854,775,807");
        TEST_MIN_MAX_FMT(unsigned long,"0","18446744073709551615"); // Unsupported range by icu - ensure fallback
        TEST_NOPAR(as::number,"-1",unsigned long);
    }
    #ifndef BOOSTER_NO_LONG_LONG
    if(sizeof(long long)==8) {
        TEST_MIN_MAX(long long,"-9,223,372,036,854,775,808","9,223,372,036,854,775,807");
        // we can't really parse this as ICU does not support this range, only format
        TEST_MIN_MAX_FMT(unsigned long long,"0","18446744073709551615"); // Unsupported range by icu - ensure fallback
        TEST_FMT(as::number,9223372036854775807ULL,"9,223,372,036,854,775,807");
        TEST_FMT(as::number,9223372036854775808ULL,"9223372036854775808"); // Unsupported range by icu - ensure fallback
        TEST_NOPAR(as::number,"-1",unsigned long long);
    }
    #endif



    TEST_FP3(as::number,std::left,std::setw(3),15,"15 ",int,15);
    TEST_FP3(as::number,std::right,std::setw(3),15," 15",int,15);
    TEST_FP3(as::number,std::setprecision(3),std::fixed,13.1,"13.100",double,13.1);
    #if BOOSTER_ICU_VER < 5601 
    // bug #13276
    TEST_FP3(as::number,std::setprecision(3),std::scientific,13.1,"1.310E1",double,13.1);
    #endif

    TEST_NOPAR(as::number,"",int);
    TEST_NOPAR(as::number,"--3",int);
    TEST_NOPAR(as::number,"y",int);

    TEST_FP1(as::percent,0.1,"10%",double,0.1);
    TEST_FP3(as::percent,std::fixed,std::setprecision(1),0.10,"10.0%",double,0.1);

    TEST_NOPAR(as::percent,"1",double);

    TEST_FP1(as::currency,1345,"$1,345.00",int,1345);
    TEST_FP1(as::currency,1345.34,"$1,345.34",double,1345.34);

    TEST_NOPAR(as::currency,"$",double);


    #if BOOSTER_ICU_VER >= 402
    TEST_FP2(as::currency,as::currency_national,1345,"$1,345.00",int,1345);
    TEST_FP2(as::currency,as::currency_national,1345.34,"$1,345.34",double,1345.34);
    TEST_FP2(as::currency,as::currency_iso,1345,"USD1,345.00",int,1345);
    TEST_FP2(as::currency,as::currency_iso,1345.34,"USD1,345.34",double,1345.34);
    #endif
    TEST_FP1(as::spellout,10,"ten",int,10);
    #if 402 <= BOOSTER_ICU_VER && BOOSTER_ICU_VER < 408
    if(e_charset=="UTF-8") {
        TEST_FMT(as::ordinal,1,"1\xcb\xa2\xe1\xb5\x97"); // 1st with st as ligatures
    }
    #else
        TEST_FMT(as::ordinal,1,"1st");
    #endif

    time_t a_date = 3600*24*(31+4); // Feb 5th
    time_t a_time = 3600*15+60*33; // 15:33:05
    time_t a_timesec = 13;
    time_t a_datetime = a_date + a_time + a_timesec;

    TEST_FP2(as::date,                as::gmt,a_datetime,"Feb 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_short ,as::gmt,a_datetime,"2/5/70",time_t,a_date);
    TEST_FP3(as::date,as::date_medium,as::gmt,a_datetime,"Feb 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_long  ,as::gmt,a_datetime,"February 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970",time_t,a_date);
    
    TEST_NOPAR(as::date>>as::date_short,"aa/bb/cc",double);

#if BOOSTER_ICU_VER >= 5901
#define GMT_FULL "Greenwich Mean Time"
#else
#define GMT_FULL "GMT"
#endif
    
    TEST_FP2(as::time,                as::gmt,a_datetime,"3:33:13 PM",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_short ,as::gmt,a_datetime,"3:33 PM",time_t,a_time);
    TEST_FP3(as::time,as::time_medium,as::gmt,a_datetime,"3:33:13 PM",time_t,a_time+a_timesec);
    #if BOOSTER_ICU_VER >= 408
    TEST_FP3(as::time,as::time_long  ,as::gmt,a_datetime,"3:33:13 PM GMT",time_t,a_time+a_timesec);
        #if BOOSTER_ICU_EXACT_VER != 40800
            // know bug #8675
            TEST_FP3(as::time,as::time_full  ,as::gmt,a_datetime,"3:33:13 PM " GMT_FULL,time_t,a_time+a_timesec);
        #endif
    #else
    TEST_FP3(as::time,as::time_long  ,as::gmt,a_datetime,"3:33:13 PM GMT+00:00",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_full  ,as::gmt,a_datetime,"3:33:13 PM GMT+00:00",time_t,a_time+a_timesec);
    #endif
    
    TEST_NOPAR(as::time,"AM",double);

    TEST_FP2(as::time,                as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_short ,as::time_zone("GMT+01:00"),a_datetime,"4:33 PM",time_t,a_time);
    TEST_FP3(as::time,as::time_medium,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM",time_t,a_time+a_timesec);

#if U_ICU_VERSION_MAJOR_NUM >= 52
#define GMT_P100 "GMT+1"
#else
#define GMT_P100 "GMT+01:00"
#endif


#if U_ICU_VERSION_MAJOR_NUM >= 50
#define PERIOD "," 
#define ICUAT " at"
#else
#define PERIOD ""
#define ICUAT ""
#endif

    TEST_FP3(as::time,as::time_long  ,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM "  GMT_P100,time_t,a_time+a_timesec);
    #if BOOSTER_ICU_VER == 308 && defined(__CYGWIN__)
    // Known faliture ICU issue
    #else
    TEST_FP3(as::time,as::time_full  ,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM GMT+01:00",time_t,a_time+a_timesec);
    #endif

    TEST_FP2(as::datetime,                                as::gmt,a_datetime,"Feb 5, 1970" PERIOD  " 3:33:13 PM",time_t,a_datetime);
    TEST_FP4(as::datetime,as::date_short ,as::time_short ,as::gmt,a_datetime,"2/5/70" PERIOD " 3:33 PM",time_t,a_date+a_time);
    TEST_FP4(as::datetime,as::date_medium,as::time_medium,as::gmt,a_datetime,"Feb 5, 1970" PERIOD " 3:33:13 PM",time_t,a_datetime);
    #if BOOSTER_ICU_VER >= 408
    TEST_FP4(as::datetime,as::date_long  ,as::time_long  ,as::gmt,a_datetime,"February 5, 1970" ICUAT " 3:33:13 PM GMT",time_t,a_datetime);
        #if BOOSTER_ICU_EXACT_VER != 40800
            // know bug #8675
            TEST_FP4(as::datetime,as::date_full  ,as::time_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970" ICUAT " 3:33:13 PM " GMT_FULL,time_t,a_datetime);
        #endif
    #else
    TEST_FP4(as::datetime,as::date_long  ,as::time_long  ,as::gmt,a_datetime,"February 5, 1970" PERIOD " 3:33:13 PM GMT+00:00",time_t,a_datetime);
    TEST_FP4(as::datetime,as::date_full  ,as::time_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970" PERIOD " 3:33:13 PM GMT+00:00",time_t,a_datetime);
    #endif

    time_t now=time(0);
    time_t lnow = now + 3600 * 4;
    char local_time_str[256];
    std::string format="%H:%M:%S";
    std::basic_string<CharType> format_string(format.begin(),format.end());
    strftime(local_time_str,sizeof(local_time_str),format.c_str(),gmtime(&lnow));
    TEST_FMT(as::ftime(format_string),now,local_time_str);
    TEST_FMT(as::ftime(format_string)<<as::gmt<<as::local_time,now,local_time_str);

    std::string marks =  
        "aAbB" 
        "cdeh"
        "HIjm"
        "Mnpr"
        "RStT"
        "xXyY"
        "Z%";

    std::string result[]= { 
        "Thu","Thursday","Feb","February",  // aAbB
        #if BOOSTER_ICU_VER >= 408
        "Thursday, February 5, 1970" ICUAT  " 3:33:13 PM " GMT_FULL, // c
        #else
        "Thursday, February 5, 1970 3:33:13 PM GMT+00:00", // c
        #endif
        "05","5","Feb", // deh
        "15","03","36","02", // HIjm
        "33","\n","PM", "03:33:13 PM",// Mnpr
        "15:33","13","\t","15:33:13", // RStT
        "Feb 5, 1970","3:33:13 PM","70","1970", // xXyY
        #if BOOSTER_ICU_VER >= 408
        GMT_FULL // Z
        #else
        "GMT+00:00" // Z
        #endif
        ,"%" }; // %

    for(unsigned i=0;i<marks.size();i++) {
        format_string.clear();
        format_string+=static_cast<CharType>('%');
        format_string+=static_cast<CharType>(marks[i]);
        TEST_FMT(as::ftime(format_string)<<as::gmt,a_datetime,result[i]);
    }

    std::string sample_f[]={
        "Now is %A, %H o'clo''ck ' or not ' ",
        "'test %H'",
        "%H'",
        "'%H'" 
    };
    std::string expected_f[] = {
        "Now is Thursday, 15 o'clo''ck ' or not ' ",
        "'test 15'",
        "15'",
        "'15'"
    };

    for(unsigned i=0;i<sizeof(sample_f)/sizeof(sample_f[0]);i++) {
        format_string.assign(sample_f[i].begin(),sample_f[i].end());
        TEST_FMT(as::ftime(format_string)<<as::gmt,a_datetime,expected_f[i]);
    }

}